

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v10::detail::print(detail *this,FILE *f,string_view text)

{
  string_view sVar1;
  bool bVar2;
  char *ptr;
  size_t count;
  FILE *f_local;
  string_view text_local;
  
  text_local.data_ = text.data_;
  sVar1.size_ = (size_t)text_local.data_;
  sVar1.data_ = (char *)f;
  f_local = f;
  bVar2 = write_console((FILE *)this,sVar1);
  if (!bVar2) {
    ptr = basic_string_view<char>::data((basic_string_view<char> *)&f_local);
    count = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
    fwrite_fully(ptr,1,count,(FILE *)this);
  }
  return;
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
  if (!write_console(f, text)) fwrite_fully(text.data(), 1, text.size(), f);
}